

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O2

int minfit(double *AB,int M,int N,int P,double *q)

{
  long lVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  double *pdVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  double *pdVar21;
  double *pdVar22;
  bool bVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double *local_118;
  long local_88;
  
  lVar20 = (long)N;
  __ptr = malloc(lVar20 * 8);
  uVar18 = 0;
  dVar24 = macheps();
  lVar16 = (long)(P + N);
  lVar15 = (long)M;
  uVar4 = 0;
  if (0 < N) {
    uVar4 = (ulong)(uint)N;
  }
  lVar1 = lVar16 * 8;
  lVar11 = lVar16 * 8 + 8;
  iVar3 = 1;
  dVar31 = 0.0;
  pdVar22 = AB;
  pdVar13 = AB;
  dVar26 = 0.0;
  while( true ) {
    uVar14 = uVar18 & 0xffffffff;
    if ((int)uVar18 < M) {
      uVar14 = (ulong)(uint)M;
    }
    if (uVar18 == uVar4) break;
    lVar8 = (long)iVar3;
    pdVar21 = (double *)(lVar11 * lVar8 + (long)AB);
    pdVar17 = pdVar22 + lVar8;
    *(double *)((long)__ptr + uVar18 * 8) = dVar26;
    dVar30 = 0.0;
    pdVar5 = pdVar13;
    for (uVar9 = uVar14; uVar18 != uVar9; uVar9 = uVar9 - 1) {
      dVar30 = dVar30 + *pdVar5 * *pdVar5;
      pdVar5 = pdVar5 + lVar16;
    }
    dVar25 = 0.0;
    if (dVar24 * dVar24 <= dVar30) {
      iVar2 = (P + N + 1) * (int)uVar18;
      dVar32 = AB[iVar2];
      if (dVar30 < 0.0) {
        dVar25 = sqrt(dVar30);
      }
      else {
        dVar25 = SQRT(dVar30);
      }
      dVar25 = (double)(~-(ulong)(dVar32 < 0.0) & (ulong)-dVar25 |
                       -(ulong)(dVar32 < 0.0) & (ulong)dVar25);
      AB[iVar2] = dVar32 - dVar25;
      for (lVar6 = lVar8; lVar6 < lVar16; lVar6 = lVar6 + 1) {
        dVar29 = 0.0;
        lVar10 = 0;
        for (uVar9 = uVar14; uVar18 != uVar9; uVar9 = uVar9 - 1) {
          dVar29 = dVar29 + *(double *)((long)pdVar13 + lVar10) *
                            *(double *)((long)pdVar17 + lVar10);
          lVar10 = lVar10 + lVar1;
        }
        lVar10 = 0;
        for (uVar9 = uVar14; uVar18 != uVar9; uVar9 = uVar9 - 1) {
          *(double *)((long)pdVar17 + lVar10) =
               *(double *)((long)pdVar13 + lVar10) * (dVar29 / (dVar32 * dVar25 - dVar30)) +
               *(double *)((long)pdVar17 + lVar10);
          lVar10 = lVar10 + lVar1;
        }
        pdVar17 = pdVar17 + 1;
      }
    }
    dVar30 = 0.0;
    q[uVar18] = dVar25;
    if ((long)uVar18 < lVar15) {
      dVar30 = 0.0;
      for (lVar6 = lVar8; lVar6 < lVar20; lVar6 = lVar6 + 1) {
        dVar30 = dVar30 + pdVar22[lVar6] * pdVar22[lVar6];
      }
    }
    dVar32 = 0.0;
    if (dVar24 * dVar24 <= dVar30) {
      dVar26 = AB[uVar18 * lVar16 + uVar18 + 1];
      if (dVar30 < 0.0) {
        dVar25 = sqrt(dVar30);
      }
      else {
        dVar25 = SQRT(dVar30);
      }
      dVar32 = (double)(~-(ulong)(dVar26 < 0.0) & (ulong)-dVar25 |
                       -(ulong)(dVar26 < 0.0) & (ulong)dVar25);
      AB[uVar18 * lVar16 + uVar18 + 1] = dVar26 - dVar32;
      for (lVar6 = lVar8; lVar10 = lVar8, lVar6 < lVar20; lVar6 = lVar6 + 1) {
        *(double *)((long)__ptr + lVar6 * 8) = pdVar22[lVar6] / (dVar26 * dVar32 - dVar30);
      }
      for (; lVar10 < lVar15; lVar10 = lVar10 + 1) {
        dVar26 = 0.0;
        pdVar17 = pdVar21;
        for (lVar6 = lVar8; lVar6 < lVar20; lVar6 = lVar6 + 1) {
          dVar26 = dVar26 + *pdVar17 * pdVar22[lVar6];
          pdVar17 = pdVar17 + 1;
        }
        for (lVar6 = 0; lVar8 + lVar6 < lVar20; lVar6 = lVar6 + 1) {
          pdVar21[lVar6] =
               *(double *)((long)__ptr + lVar6 * 8 + lVar8 * 8) * dVar26 + pdVar21[lVar6];
        }
        pdVar21 = pdVar21 + lVar16;
      }
      dVar25 = q[uVar18];
      dVar26 = *(double *)((long)__ptr + uVar18 * 8);
    }
    uVar18 = uVar18 + 1;
    dVar30 = ABS(dVar26) + ABS(dVar25);
    if (ABS(dVar26) + ABS(dVar25) <= dVar31) {
      dVar30 = dVar31;
    }
    dVar31 = dVar30;
    iVar3 = iVar3 + 1;
    pdVar13 = pdVar13 + lVar16 + 1;
    pdVar22 = pdVar22 + lVar16;
    dVar26 = dVar32;
  }
  uVar14 = (ulong)(N + -1);
  pdVar22 = AB + lVar16 * uVar14;
  pdVar13 = AB + uVar14;
  for (uVar9 = uVar14; -1 < (long)uVar9; uVar9 = uVar9 - 1) {
    if ((dVar26 != 0.0) || (NAN(dVar26))) {
      dVar30 = AB[uVar9 * lVar16 + uVar9 + 1];
      lVar6 = (long)(int)uVar18;
      pdVar17 = (double *)((long)pdVar13 + lVar1 * lVar6);
      for (lVar8 = lVar6; lVar8 < lVar20; lVar8 = lVar8 + 1) {
        *pdVar17 = pdVar22[lVar8] / (dVar26 * dVar30);
        pdVar17 = pdVar17 + lVar16;
      }
      pdVar17 = (double *)(lVar11 * lVar6 + (long)AB);
      for (lVar8 = lVar6; lVar8 < lVar20; lVar8 = lVar8 + 1) {
        dVar26 = 0.0;
        pdVar5 = pdVar17;
        for (lVar10 = lVar6; lVar10 < lVar20; lVar10 = lVar10 + 1) {
          dVar26 = dVar26 + pdVar22[lVar10] * *pdVar5;
          pdVar5 = pdVar5 + lVar16;
        }
        lVar19 = 0;
        for (lVar10 = lVar6; lVar10 < lVar20; lVar10 = lVar10 + 1) {
          *(double *)((long)pdVar17 + lVar19) =
               *(double *)((long)pdVar13 + lVar19 + lVar1 * lVar6) * dVar26 +
               *(double *)((long)pdVar17 + lVar19);
          lVar19 = lVar19 + lVar1;
        }
        pdVar17 = pdVar17 + 1;
      }
    }
    lVar8 = (long)(int)uVar18;
    pdVar17 = (double *)(lVar1 * lVar8 + (long)pdVar13);
    for (; lVar8 < lVar20; lVar8 = lVar8 + 1) {
      *pdVar17 = 0.0;
      pdVar22[lVar8] = 0.0;
      pdVar17 = pdVar17 + lVar16;
    }
    AB[uVar9 * lVar16 + uVar9] = 1.0;
    dVar26 = *(double *)((long)__ptr + uVar9 * 8);
    uVar18 = uVar9 & 0xffffffff;
    pdVar22 = pdVar22 + -lVar16;
    pdVar13 = pdVar13 + -1;
  }
  pdVar22 = AB + lVar15 * lVar16;
  for (; lVar11 = lVar20, lVar15 < lVar20; lVar15 = lVar15 + 1) {
    for (; lVar11 < lVar16; lVar11 = lVar11 + 1) {
      pdVar22[lVar11] = 0.0;
    }
    pdVar22 = pdVar22 + lVar16;
  }
  dVar24 = dVar24 * dVar31;
  local_118 = AB + uVar14;
LAB_0013c463:
  if ((long)uVar14 < 0) {
    free(__ptr);
    return 0;
  }
  uVar18 = uVar14 - 1;
  iVar3 = 0;
  do {
    if (iVar3 == 0x32) {
      puts("Convergence Not Achieved ");
      return 0xf;
    }
    iVar3 = iVar3 + 1;
    uVar7 = uVar14 & 0xffffffff;
    uVar9 = uVar14;
    while( true ) {
      uVar12 = (uint)uVar9;
      iVar2 = (int)uVar7;
      if ((int)uVar12 < 0) break;
      if (ABS(*(double *)((long)__ptr + (uVar9 & 0xffffffff) * 8)) <= dVar24) goto LAB_0013c5f0;
      if (ABS(q[(uVar9 & 0xffffffff) - 1]) <= dVar24) goto LAB_0013c4cf;
      uVar9 = uVar9 - 1;
      uVar7 = (ulong)(iVar2 - 1);
    }
    uVar12 = 0xffffffff;
LAB_0013c4cf:
    if ((long)uVar9 < 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pdVar22 = (double *)(lVar1 * uVar9 + (long)AB);
    if (iVar2 < 0) {
      iVar2 = -1;
    }
    iVar2 = (iVar2 + -1) * (P + N);
    dVar26 = 0.0;
    dVar31 = 1.0;
    for (; (long)uVar9 <= (long)uVar14; uVar9 = uVar9 + 1) {
      dVar30 = *(double *)((long)__ptr + uVar9 * 8);
      dVar31 = dVar31 * dVar30;
      *(double *)((long)__ptr + uVar9 * 8) = dVar26 * dVar30;
      if (ABS(dVar31) <= dVar24) break;
      dVar26 = q[uVar9];
      dVar30 = hypot(dVar31,dVar26);
      q[uVar9] = dVar30;
      dVar26 = dVar26 / dVar30;
      dVar31 = -dVar31 / dVar30;
      for (lVar15 = lVar20; lVar15 < lVar16; lVar15 = lVar15 + 1) {
        dVar30 = AB[iVar2 + lVar15];
        dVar25 = pdVar22[lVar15];
        AB[iVar2 + lVar15] = dVar30 * dVar26 + dVar31 * dVar25;
        pdVar22[lVar15] = dVar25 * dVar26 - dVar31 * dVar30;
      }
      pdVar22 = pdVar22 + lVar16;
    }
    uVar9 = (ulong)uVar12;
LAB_0013c5f0:
    dVar26 = q[uVar14];
    if ((int)uVar9 == (int)uVar14) break;
    lVar11 = (long)(int)uVar9;
    dVar31 = q[lVar11];
    dVar30 = q[uVar18];
    dVar25 = *(double *)((long)__ptr + uVar18 * 8);
    dVar32 = *(double *)((long)__ptr + uVar14 * 8);
    dVar25 = ((dVar30 / dVar32 + ((dVar25 - dVar26) / dVar30) * ((dVar26 + dVar25) / dVar32)) -
             dVar32 / dVar30) * 0.5;
    dVar29 = hypot(dVar25,1.0);
    dVar25 = (dVar32 / dVar31) *
             (dVar30 / ((double)((ulong)-dVar29 & -(ulong)(dVar25 < 0.0) |
                                ~-(ulong)(dVar25 < 0.0) & (ulong)dVar29) + dVar25) - dVar32) +
             (dVar31 - (dVar26 / dVar31) * dVar26);
    pdVar22 = AB + lVar11 + 1;
    local_88 = lVar11 << 0x20;
    pdVar17 = (double *)((lVar11 + 1) * lVar1 + (long)AB);
    pdVar13 = (double *)(lVar1 * lVar11 + (long)AB);
    dVar26 = 1.0;
    dVar30 = 1.0;
    lVar15 = lVar11;
    while (lVar15 < (long)uVar14) {
      lVar8 = lVar15 + 1;
      dVar32 = *(double *)((long)__ptr + lVar8 * 8);
      dVar29 = q[lVar8];
      dVar30 = dVar30 * dVar32;
      dVar32 = dVar26 * dVar32;
      dVar27 = hypot(dVar25,dVar30);
      *(double *)((long)__ptr + lVar15 * 8) = dVar27;
      dVar25 = dVar25 / dVar27;
      dVar27 = dVar30 / dVar27;
      dVar30 = dVar29 * dVar27;
      lVar6 = local_88;
      pdVar5 = pdVar22;
      uVar9 = uVar4;
      while (bVar23 = uVar9 != 0, uVar9 = uVar9 - 1, bVar23) {
        dVar26 = *(double *)((long)AB + (lVar6 >> 0x1d));
        dVar28 = *pdVar5;
        *(double *)((long)AB + (lVar6 >> 0x1d)) = dVar26 * dVar25 + dVar27 * dVar28;
        *pdVar5 = dVar28 * dVar25 - dVar27 * dVar26;
        pdVar5 = pdVar5 + lVar16;
        lVar6 = lVar6 + (lVar16 << 0x20);
      }
      dVar26 = dVar31 * dVar25 + dVar32 * dVar27;
      dVar28 = hypot(dVar26,dVar30);
      q[lVar15] = dVar28;
      dVar30 = dVar30 / dVar28;
      if ((dVar28 == 0.0) && (!NAN(dVar28))) {
        dVar30 = dVar27;
      }
      dVar26 = dVar26 / dVar28;
      if ((dVar28 == 0.0) && (!NAN(dVar28))) {
        dVar26 = dVar25;
      }
      dVar31 = dVar32 * dVar25 + -dVar31 * dVar27;
      dVar29 = dVar29 * dVar25;
      for (lVar15 = lVar20; lVar15 < lVar16; lVar15 = lVar15 + 1) {
        dVar25 = pdVar13[lVar15];
        dVar32 = pdVar17[lVar15];
        pdVar13[lVar15] = dVar25 * dVar26 + dVar30 * dVar32;
        pdVar17[lVar15] = dVar32 * dVar26 - dVar30 * dVar25;
      }
      dVar25 = dVar31 * dVar26 + dVar29 * dVar30;
      dVar31 = dVar29 * dVar26 + -dVar30 * dVar31;
      pdVar22 = pdVar22 + 1;
      local_88 = local_88 + 0x100000000;
      pdVar17 = pdVar17 + lVar16;
      pdVar13 = pdVar13 + lVar16;
      lVar15 = lVar8;
    }
    *(undefined8 *)((long)__ptr + lVar11 * 8) = 0;
    *(double *)((long)__ptr + uVar14 * 8) = dVar25;
    q[uVar14] = dVar31;
  } while( true );
  if (dVar26 < 0.0) {
    q[uVar14] = -dVar26;
    pdVar22 = local_118;
    uVar14 = uVar4;
    while (bVar23 = uVar14 != 0, uVar14 = uVar14 - 1, bVar23) {
      *pdVar22 = -*pdVar22;
      pdVar22 = pdVar22 + lVar16;
    }
  }
  local_118 = local_118 + -1;
  uVar14 = uVar18;
  goto LAB_0013c463;
}

Assistant:

int minfit(double *AB,int M,int N,int P,double *q) {
	int i,j,k,l,t,t2,ierr,cancel,iter,l1,np,n1;
	double eps,g,x,s,temp,f,h,tol,c,y,z;
	double *e;
	/*
     THIS SUBROUTINE IS THE MODIFIED C TRANSLATION OF THE
     EISPACK FORTRAN TRANSLATION OF THE ALGOL PROCEDURE MINFIT,
     NUM. MATH. 14, 403-420(1970) BY GOLUB AND REINSCH.
     HANDBOOK FOR AUTO. COMP., VOL II-LINEAR ALGEBRA, 134-151(1971).
	 */
	/*
	 * AB MAX(M,N) X (N+P)
	 * q N X 1
	 *
	 * On Input AB = [A:B]
	 * On Output AB = [V:C] where C = U'*B
	 */

	e = (double*) malloc(sizeof(double) * N);
	ierr = 0;
	eps = macheps();
	tol = eps * eps;
	g = x = 0.0;
	np = N + P;

	for(i = 0; i < N;++i) {
		l = i+1;
		e[i] = g;
		s = 0.0;

		for(k = i; k < M;++k) {
			t = k * np;
			temp = AB[t+i];
			s += temp*temp;
		}
		if (s < tol) {
			g = 0.0;
		} else {
			f = AB[i*np+i];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
			AB[i*np+i] = f - g;

			for(j = l; j < np;++j) {
				s = 0.0;
				for(k = i; k < M;++k) {
					t = k * np;
					s += (AB[t+i]*AB[t+j]);
				}
				f = s / h;
				for(k = i; k < M;++k) {
					t = k * np;
					AB[t+j] += (f * AB[t+i]);
				}
			}

		}

        q[i] = g;
        s = 0.0;
        t = i * np;
        if (i < M) {
			for(k = l; k < N;++k) {
				temp = AB[t+k];
				s = s + temp*temp;
			}
        }
        if (s < tol) {
        	g = 0.0;
        } else {
        	f = AB[t+i+1];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
            AB[t+i+1] = f - g;
            for(k = l;k < N;++k) {
              	e[k] = AB[t+k] / h;
            }

            for (j = l; j < M; j++) {
                s = 0.0;
                t2 = j * np;
                for (k = l; k < N; k++) {
                     s += AB[t2+k] * AB[t+k];
                }
                for (k = l; k < N; k++) {
                     AB[t2+k] += s * e[k];
                }
            }

        }

        temp = fabs(q[i]) + fabs(e[i]);

        if (x < temp) {
        	x = temp;
        }
	}

	//Accumulating Right Hand Transformations

	for(i = N - 1;i >= 0;--i) {
		t = i * np;
		if (g != 0.0) {
			h = AB[t+i+1] * g;
			for(j = l;j < N;++j) {
				AB[j*np+i] = AB[t+j] / h;
			}
			for(j = l;j < N;++j) {
				s = 0.0;
				for(k = l; k < N;++k) {
					s += AB[t+k] * AB[k*np+j];
				}
				for(k = l; k < N;++k) {
					AB[k*np+j] += (s * AB[k*np+i]);
				}
			}
		}
		for(j = l; j < N;++j) {
			AB[t+j] = AB[j*np+i] = 0.0;
		}

		AB[t+i] = 1.0;
		g = e[i];
		l = i;
	}

	eps = eps *x;
	n1 = N + 1;

	for(i = M; i < N;++i) {
		for(j = n1 - 1; j < np;++j)  {
			AB[i * np +j] = 0.0;
		}
	}

	for(k = N - 1; k >= 0; --k) {
		iter = 0;

		while(1) {
			iter++;
			if (iter > SVDMAXITER) {
				printf("Convergence Not Achieved \n");
				return 15;
			}

			cancel = 1;
			for(l = k; l >= 0; --l) {
				if (fabs(e[l]) <= eps) {
					cancel = 0; //test f convergence
					break;
				}
				if (fabs(q[l-1]) <= eps) {
					//Cancel
					break;
				}
			}
			if (cancel) {
				c = 0.0;
				s = 1.0;
				l1 = l - 1;
				for(i = l; i <= k;++i) {
					f = s*e[i];
					e[i] *= c;
					if (fabs(f) <= eps) {
						break;
					}
					g = q[i];
					h = q[i] = hypot(f,g);
					c = g/h;
					s = -f/h;
					for(j = n1-1; j < np;++j) {
						y = AB[l1 * np + j];
						z = AB[i * np + j];

						AB[l1 * np + j] = y * c + z * s;
						AB[i * np + j] = z * c - y * s;
					}
				}
			}
			z = q[k];
			if (l != k) {
				x = q[l];
				y = q[k-1];
				g = e[k-1];
				h = e[k];
				f = 0.5 * (((g + z) / h) * ((g - z) / y) + y / h - h / y);
				g = hypot(f,1.0);
				if (f < 0.0) {
					temp = f - g;
				} else {
					temp = f+g;
				}
				f = x - (z / x) * z + (h / x) * (y / temp - h);

				//Next QR Transformation

				c = s = 1.0;
				for(i = l+1; i <= k;++i) {
					g = e[i];
					y = q[i];
					h = s * g;
					g = c * g;
					e[i-1] = z = hypot(f,h);
                    c = f / z;
                    s = h / z;
                    f = x * c + g * s;
                    g = g * c - x * s;
                    h = y * s;
                    y *= c;
                    for(j = 0; j < N;++j) {
                    	t = j * np;
                        x = AB[t+i-1];
                        z = AB[t+i];
                        AB[t+i-1] = x * c + z * s;
                        AB[t+i] = z * c - x * s;
                    }
                    q[i-1] = z = hypot(f,h);
                    if (z != 0.0) {
                        c = f / z;
                        s = h / z;
                    }
                    f = c * g + s * y;
                    x = c * y - s * g;
                    for(j = n1-1; j < np;++j) {
                        y = AB[(i-1) * np + j];
                        z = AB[i * np + j];
                        AB[(i-1) * np + j] = y * c + z * s;
                        AB[i * np + j] = z * c - y * s;
                    }
				}
                    e[l] = 0.0;
                    e[k] = f;
                    q[k] = x;

			} else {
				//convergence
                if (z < 0.0) {
                    q[k] = -z;
                    for (j = 0; j < N; j++) {
                    	t = j * np;
                        AB[t+k] = -AB[t+k];
                    }
                }
                break;
			}
		}
	}

	free(e);
	return ierr;

}